

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_xu_index.c
# Opt level: O0

int dwarf_get_debugfission_for_key
              (Dwarf_Debug dbg,Dwarf_Sig8 *key,char *key_type,Dwarf_Debug_Fission_Per_CU *percu_out,
              Dwarf_Error *error)

{
  Dwarf_Xu_Index_Header local_50;
  Dwarf_Xu_Index_Header xuhdr;
  Dwarf_Unsigned percu_index;
  Dwarf_Error *ppDStack_38;
  int sres;
  Dwarf_Error *error_local;
  Dwarf_Debug_Fission_Per_CU *percu_out_local;
  char *key_type_local;
  Dwarf_Sig8 *key_local;
  Dwarf_Debug dbg_local;
  
  percu_index._4_4_ = 0;
  xuhdr = (Dwarf_Xu_Index_Header)0x0;
  local_50 = (Dwarf_Xu_Index_Header)0x0;
  ppDStack_38 = error;
  error_local = (Dwarf_Error *)percu_out;
  percu_out_local = (Dwarf_Debug_Fission_Per_CU *)key_type;
  key_type_local = key->signature;
  key_local = (Dwarf_Sig8 *)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_debugfission_for_key()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (((key == (Dwarf_Sig8 *)0x0) || (key_type == (char *)0x0)) ||
          (percu_out == (Dwarf_Debug_Fission_Per_CU *)0x0)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x10c,
                        "DW_DLE_XU_TYPE_ARG_ERROR: dw_key, dw_keytype, or Dwarf_Debug_Fission_Per_CU pointer* to return is not valid"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    percu_index._4_4_ = _dwarf_load_debug_info(dbg,error);
    if (percu_index._4_4_ == 1) {
      dbg_local._4_4_ = 1;
    }
    else {
      percu_index._4_4_ = _dwarf_load_debug_types((Dwarf_Debug)key_local,ppDStack_38);
      if (percu_index._4_4_ == 1) {
        dbg_local._4_4_ = 1;
      }
      else {
        percu_index._4_4_ =
             _dwarf_get_xuhdr((Dwarf_Debug)key_local,(char *)percu_out_local,&local_50,ppDStack_38);
        dbg_local._4_4_ = percu_index._4_4_;
        if ((percu_index._4_4_ == 0) &&
           (percu_index._4_4_ =
                 _dwarf_search_fission_for_key
                           ((Dwarf_Debug)key_local,local_50,(Dwarf_Sig8 *)key_type_local,
                            (Dwarf_Unsigned *)&xuhdr,ppDStack_38),
           dbg_local._4_4_ = percu_index._4_4_, percu_index._4_4_ == 0)) {
          dbg_local._4_4_ =
               transform_xu_to_dfp(local_50,(Dwarf_Unsigned)xuhdr,(Dwarf_Sig8 *)key_type_local,
                                   (char *)percu_out_local,(Dwarf_Debug_Fission_Per_CU *)error_local
                                   ,ppDStack_38);
        }
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_debugfission_for_key(Dwarf_Debug dbg,
    Dwarf_Sig8  *key  /* pointer to hash signature */,
    const char  *key_type  /*  "cu" or "tu" */,
    Dwarf_Debug_Fission_Per_CU *  percu_out,
    Dwarf_Error *error)
{
    int sres = 0;
    Dwarf_Unsigned percu_index = 0;
    Dwarf_Xu_Index_Header xuhdr = 0;

    CHECK_DBG(dbg,error,"dwarf_get_debugfission_for_key()");
    if (!key || !key_type || !percu_out) {
        _dwarf_error_string(0,error,DW_DLE_XU_TYPE_ARG_ERROR,
            "DW_DLE_XU_TYPE_ARG_ERROR: dw_key, dw_keytype, or "
            "Dwarf_Debug_Fission_Per_CU pointer* to return "
            "is not valid");
        return DW_DLV_ERROR;
    }

    sres = _dwarf_load_debug_info(dbg,error);
    if (sres == DW_DLV_ERROR) {
        return sres;
    }
    sres = _dwarf_load_debug_types(dbg,error);
    if (sres == DW_DLV_ERROR) {
        return sres;
    }
    /*  Returns already existing xuhdr */
    sres = _dwarf_get_xuhdr(dbg,key_type, &xuhdr,error);
    if (sres != DW_DLV_OK) {
        return sres;
    }
    /*  Search in that xu data. */
    sres = _dwarf_search_fission_for_key(dbg,
        xuhdr,key,&percu_index,error);
    if (sres != DW_DLV_OK) {
        return sres;
    }
    sres = transform_xu_to_dfp(xuhdr,percu_index,key,
        key_type,percu_out,error);
    return sres;
}